

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Tree::set_val_tag(Tree *this,size_t node,csubstr tag)

{
  Location loc;
  bool bVar1;
  error_flags eVar2;
  NodeData *pNVar3;
  size_t in_RCX;
  char *in_RDX;
  Tree *in_RSI;
  size_t in_RDI;
  size_t in_stack_ffffffffffffff58;
  size_t in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  Location *in_stack_ffffffffffffff70;
  NodeType_e in_stack_ffffffffffffff78;
  Tree *in_stack_ffffffffffffff88;
  NodeType_e in_stack_ffffffffffffffa8;
  Tree *pTVar4;
  size_t sVar5;
  Tree *pTVar6;
  
  pTVar4 = in_RSI;
  sVar5 = in_RDI;
  pNVar3 = _p(in_RSI,in_stack_ffffffffffffffa8);
  if ((((pNVar3->m_type).type & VAL) == NOTYPE) &&
     (pTVar6 = in_RSI, pNVar3 = _p(in_RSI,in_stack_ffffffffffffffa8),
     ((pNVar3->m_type).type & (STREAM|MAP)) == NOTYPE)) {
    eVar2 = get_error_flags();
    in_stack_ffffffffffffff78 = in_stack_ffffffffffffffa8;
    if (((eVar2 & 1) != 0) &&
       (bVar1 = is_debugger_attached(), in_stack_ffffffffffffff78 = in_stack_ffffffffffffffa8, bVar1
       )) {
      trap_instruction();
      in_stack_ffffffffffffff78 = in_stack_ffffffffffffffa8;
    }
    Location::Location(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60
                       ,in_stack_ffffffffffffff58);
    loc.super_LineCol.line = in_RCX;
    loc.super_LineCol.offset = (size_t)in_RDX;
    loc.super_LineCol.col = (size_t)pTVar4;
    loc.name.str = (char *)sVar5;
    loc.name.len = (size_t)pTVar6;
    in_stack_ffffffffffffffa8 = in_stack_ffffffffffffff78;
    error<50ul>((char (*) [50])in_RSI,loc);
  }
  pNVar3 = _p(in_RSI,in_stack_ffffffffffffffa8);
  (pNVar3->m_val).tag.str = in_RDX;
  (pNVar3->m_val).tag.len = in_RCX;
  _add_flags(in_stack_ffffffffffffff88,in_RDI,in_stack_ffffffffffffff78);
  return;
}

Assistant:

void set_val_tag(size_t node, csubstr tag) { RYML_ASSERT(has_val(node) || is_container(node)); _p(node)->m_val.tag = tag; _add_flags(node, VALTAG); }